

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrDEC0xc6(CPU *this)

{
  uint16_t addr;
  Memory *this_00;
  byte bVar1;
  uint8_t uVar2;
  byte value;
  
  addr = this->PC;
  this->PC = addr + 1;
  bVar1 = Memory::Read8(this->m,addr);
  this_00 = this->m;
  uVar2 = Memory::Read8(this_00,(ushort)bVar1);
  value = uVar2 - 1;
  this->field_0x2e = value >> 7 | (value == 0) << 6 | this->field_0x2e & 0xbe;
  Memory::Write8(this_00,(ushort)bVar1,value);
  return 5;
}

Assistant:

int CPU::instrDEC0xc6() {
	uint16_t address = zeropage_addr_j();
	m->Write8(address, DEC(m->Read8(address)));
	return 5;
}